

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

idx_t __thiscall duckdb::Pipeline::UpdateBatchIndex(Pipeline *this,idx_t old_index,idx_t new_index)

{
  bool bVar1;
  reference puVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  InternalException *in_RDX;
  string *in_RDI;
  iterator entry;
  lock_guard<std::mutex> l;
  multiset<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffed8;
  multiset<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffee0;
  const_iterator in_stack_fffffffffffffee8;
  unsigned_long in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  InternalException *in_stack_ffffffffffffff20;
  allocator *params;
  allocator local_a1;
  string local_a0 [32];
  _Self local_80;
  _Self local_78;
  undefined1 local_69;
  _Base_ptr local_68;
  allocator local_49;
  string local_48 [32];
  _Base_ptr local_28;
  InternalException *local_18;
  
  local_18 = in_RDX;
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffee0,
             (mutex_type *)in_stack_fffffffffffffed8);
  local_28 = (_Base_ptr)
             ::std::
             multiset<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             begin(in_stack_fffffffffffffed8);
  puVar2 = ::std::_Rb_tree_const_iterator<unsigned_long>::operator*
                     ((_Rb_tree_const_iterator<unsigned_long> *)0x997b53);
  if (local_18 < (InternalException *)*puVar2) {
    local_69 = 1;
    uVar3 = __cxa_allocate_exception(0x10);
    params = &local_49;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_48,"Processing batch index %llu, but previous min batch index was %llu",params)
    ;
    local_68 = (_Base_ptr)
               ::std::
               multiset<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               begin(in_stack_fffffffffffffed8);
    ::std::_Rb_tree_const_iterator<unsigned_long>::operator*
              ((_Rb_tree_const_iterator<unsigned_long> *)0x997bdb);
    InternalException::InternalException<unsigned_long,unsigned_long>
              (local_18,in_RDI,(unsigned_long)params,uVar3);
    local_69 = 0;
    __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
  }
  local_78._M_node =
       (_Base_ptr)
       ::std::multiset<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
       find(in_stack_fffffffffffffee8._M_node,(key_type *)in_stack_fffffffffffffee0);
  local_80._M_node =
       (_Base_ptr)
       ::std::multiset<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 (in_stack_fffffffffffffed8);
  bVar1 = ::std::operator==(&local_78,&local_80);
  if (!bVar1) {
    ::std::multiset<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
    erase_abi_cxx11_(in_stack_fffffffffffffee0,in_stack_fffffffffffffee8);
    ::std::multiset<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              ((multiset<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffee8._M_node,(value_type_conflict1 *)in_stack_fffffffffffffee0);
    ::std::multiset<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
              (in_stack_fffffffffffffed8);
    puVar2 = ::std::_Rb_tree_const_iterator<unsigned_long>::operator*
                       ((_Rb_tree_const_iterator<unsigned_long> *)0x997e5a);
    uVar3 = *puVar2;
    ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x997e6f);
    return uVar3;
  }
  uVar4 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_a0,"Batch index %llu was not found in set of active batch indexes",&local_a1);
  InternalException::InternalException<unsigned_long>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  __cxa_throw(uVar4,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

idx_t Pipeline::UpdateBatchIndex(idx_t old_index, idx_t new_index) {
	lock_guard<mutex> l(batch_lock);
	if (new_index < *batch_indexes.begin()) {
		throw InternalException("Processing batch index %llu, but previous min batch index was %llu", new_index,
		                        *batch_indexes.begin());
	}
	auto entry = batch_indexes.find(old_index);
	if (entry == batch_indexes.end()) {
		throw InternalException("Batch index %llu was not found in set of active batch indexes", old_index);
	}
	batch_indexes.erase(entry);
	batch_indexes.insert(new_index);
	return *batch_indexes.begin();
}